

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_clone(container_t *c,uint8_t typecode)

{
  array_container_t *paVar1;
  bitset_container_t *pbVar2;
  run_container_t *prVar3;
  byte local_9;
  
  local_9 = typecode;
  paVar1 = (array_container_t *)container_unwrap_shared(c,&local_9);
  switch(local_9) {
  case 1:
    pbVar2 = bitset_container_clone((bitset_container_t *)paVar1);
    return pbVar2;
  case 2:
    paVar1 = array_container_clone(paVar1);
    return paVar1;
  case 3:
    prVar3 = run_container_clone((run_container_t *)paVar1);
    return prVar3;
  case 4:
    puts("shared containers are not cloneable");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d2c,"container_t *container_clone(const container_t *, uint8_t)");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d2f,"container_t *container_clone(const container_t *, uint8_t)");
  }
}

Assistant:

container_t *container_clone(const container_t *c, uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_clone(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_clone(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_clone(const_CAST_run(c));
        case SHARED_CONTAINER_TYPE:
            printf("shared containers are not cloneable\n");
            assert(false);
            return NULL;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}